

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImFormatString(char *buf,int buf_size,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  int iVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (0 < buf_size) {
    local_d8 = local_c8;
    local_e0 = &args[0].overflow_arg_area;
    local_e8 = 0x3000000018;
    iVar1 = vsnprintf(buf,(ulong)(uint)buf_size,fmt,&local_e8);
    iVar2 = buf_size + -1;
    if (iVar1 < buf_size) {
      iVar2 = iVar1;
    }
    if (iVar1 == -1) {
      iVar2 = buf_size + -1;
    }
    buf[iVar2] = '\0';
    return iVar2;
  }
  __assert_fail("buf_size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0x3ba,"int ImFormatString(char *, int, const char *, ...)");
}

Assistant:

int ImFormatString(char* buf, int buf_size, const char* fmt, ...)
{
    IM_ASSERT(buf_size > 0);
    va_list args;
    va_start(args, fmt);
    int w = vsnprintf(buf, buf_size, fmt, args);
    va_end(args);
    if (w == -1 || w >= buf_size)
        w = buf_size - 1;
    buf[w] = 0;
    return w;
}